

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O0

void __thiscall
CVmObjClass::restore_from_file(CVmObjClass *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  uint uVar1;
  vm_intcls_ext *pvVar2;
  CVmObjFixup *this_00;
  ulong uVar3;
  vm_val_t *in_RDI;
  char buf [5];
  size_t expected_len;
  size_t len;
  vm_intcls_ext *ext;
  CVmFile *in_stack_ffffffffffffffc0;
  CVmObjClass *in_stack_ffffffffffffffc8;
  char *buf_00;
  
  pvVar2 = alloc_ext(in_stack_ffffffffffffffc8);
  uVar1 = CVmFile::read_uint2(in_stack_ffffffffffffffc0);
  this_00 = (CVmObjFixup *)(ulong)uVar1;
  buf_00 = (char *)0xd;
  uVar1 = CVmFile::read_uint2(in_stack_ffffffffffffffc0);
  pvVar2->meta_idx = uVar1;
  uVar3 = CVmFile::read_uint4(in_stack_ffffffffffffffc0);
  pvVar2->mod_obj = (vm_obj_id_t)uVar3;
  vm_val_t::set_nil(&pvVar2->class_state);
  if ((CVmObjFixup *)0xc < this_00) {
    CVmFile::read_bytes((CVmFile *)this_00,buf_00,(size_t)in_stack_ffffffffffffffc0);
    CVmObjFixup::fix_dh(this_00,buf_00);
    vmb_get_dh((char *)in_stack_ffffffffffffffc0,in_RDI);
  }
  if ((CVmObjFixup *)0xd < this_00) {
    CVmFile::set_pos_from_cur(in_stack_ffffffffffffffc0,(long)in_RDI);
  }
  register_meta((CVmObjClass *)in_stack_ffffffffffffffc0,(vm_obj_id_t)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

void CVmObjClass::restore_from_file(VMG_ vm_obj_id_t self,
                                    CVmFile *fp, CVmObjFixup *fixups)
{
    /* allocate/reallocate the extension */
    vm_intcls_ext *ext = alloc_ext(vmg0_);

    /* read the length */
    size_t len = fp->read_uint2();
    const size_t expected_len = 2+2+4+VMB_DATAHOLDER;

    /* 
     *   read the metaclass index and modifier object ID; note that modifier
     *   objects are always root set objects, so there's no need to worry
     *   about fixups 
     */
    ext->meta_idx = fp->read_uint2();
    ext->mod_obj = (vm_obj_id_t)fp->read_uint4();

    /* if we have a class state value, read it */
    ext->class_state.set_nil();
    if (len >= 2+2+4+VMB_DATAHOLDER)
    {
        char buf[VMB_DATAHOLDER];
        fp->read_bytes(buf, VMB_DATAHOLDER);
        fixups->fix_dh(vmg_ buf);
        vmb_get_dh(buf, &ext->class_state);
    }

    /* skip any extra data we don't recognize */
    if (len > expected_len)
        fp->set_pos_from_cur(len - expected_len);

    /* register myself with the metaclass table */
    register_meta(vmg_ self);
}